

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O3

int glib_random_bytes(void *buf,size_t len)

{
  guint32 gVar1;
  GRand *pGVar2;
  void *pvVar3;
  GRand *pGVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  GRand *rand;
  guint32 local_2c;
  
  pGVar2 = (GRand *)__tls_get_addr(&PTR_010f6bb8);
  pGVar4 = pGVar2;
  rand = *(GRand **)pGVar2->mt;
  if (*(GRand **)pGVar2->mt == (GRand *)0x0) {
    pGVar4 = g_rand_new();
    *(GRand **)pGVar2->mt = pGVar4;
    rand = pGVar4;
  }
  gVar1 = (guint32)pGVar4;
  if (len < 4) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    do {
      gVar1 = g_rand_int(rand);
      *(guint32 *)((long)buf + uVar5) = gVar1;
      uVar7 = uVar5 + 4;
      uVar6 = uVar5 + 8;
      uVar5 = uVar7;
    } while (uVar6 <= len);
  }
  if (uVar7 < len) {
    local_2c = g_rand_int(rand);
    pvVar3 = memcpy((void *)((long)buf + uVar7),&local_2c,uVar7 - len);
    gVar1 = (guint32)pvVar3;
  }
  return gVar1;
}

Assistant:

static int glib_random_bytes(void *buf, size_t len)
{
#ifndef _MSC_VER
    GRand *rand = thread_rand;
    size_t i;
    uint32_t x;

    if (unlikely(rand == NULL)) {
        /* Thread not initialized for a cpu, or main w/o -seed.  */
        thread_rand = rand = g_rand_new();
    }

    for (i = 0; i + 4 <= len; i += 4) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, 4);
    }
    if (i < len) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, i - len);
    }
#endif
    return 0;
}